

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part.c
# Opt level: O0

exr_result_t
exr_get_chunk_unpacked_size(exr_const_context_t_conflict ctxt,int part_index,uint64_t *out)

{
  exr_const_context_t_conflict c;
  exr_attribute_t *peVar1;
  undefined8 *in_RDX;
  int in_ESI;
  char *in_RDI;
  exr_const_priv_part_t part;
  uint64_t sz;
  exr_const_context_t_conflict in_stack_ffffffffffffffd0;
  exr_result_t local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = 2;
  }
  else {
    if (*in_RDI == '\x01') {
      internal_exr_lock(in_stack_ffffffffffffffd0);
    }
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      if (*in_RDI == '\x01') {
        internal_exr_unlock(in_stack_ffffffffffffffd0);
      }
      local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      c = *(exr_const_context_t_conflict *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
      peVar1 = (c->first_part).channels;
      if (*in_RDI == '\x01') {
        internal_exr_unlock(c);
      }
      if (in_RDX == (undefined8 *)0x0) {
        local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,3);
      }
      else {
        *in_RDX = peVar1;
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_get_chunk_unpacked_size (
    exr_const_context_t ctxt, int part_index, uint64_t* out)
{
    uint64_t sz;
    EXR_LOCK_WRITE_AND_DEFINE_PART (part_index);
    sz = part->unpacked_size_per_chunk;
    if (ctxt->mode == EXR_CONTEXT_WRITE) internal_exr_unlock (ctxt);

    if (!out) return ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT);

    *out = sz;
    return EXR_ERR_SUCCESS;
}